

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_0::clearColorReference
               (Surface *ref,float red,float green,float blue,float alpha)

{
  Vector<float,_4> local_58;
  PixelBufferAccess local_48;
  float local_20;
  float local_1c;
  float alpha_local;
  float blue_local;
  float green_local;
  float red_local;
  Surface *ref_local;
  
  local_20 = alpha;
  local_1c = blue;
  alpha_local = green;
  blue_local = red;
  _green_local = ref;
  tcu::Surface::getAccess(&local_48,ref);
  tcu::Vector<float,_4>::Vector(&local_58,blue_local,alpha_local,local_1c,local_20);
  tcu::clear(&local_48,&local_58);
  return;
}

Assistant:

void clearColorReference (tcu::Surface* ref, float red, float green, float blue, float alpha)
{
	tcu::clear(ref->getAccess(), tcu::Vec4(red, green, blue, alpha));
}